

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::addAnchor_helper
          (QGraphicsAnchorLayoutPrivate *this,QGraphicsLayoutItem *firstItem,AnchorPoint firstEdge,
          QGraphicsLayoutItem *secondItem,AnchorPoint secondEdge,AnchorData *data)

{
  QGraphicsLayoutItem *pQVar1;
  AnchorVertex *first;
  AnchorVertex *second;
  AnchorData *pAVar2;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData> *this_00;
  
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  first = addInternalVertex(this,firstItem,firstEdge);
  second = addInternalVertex(this,secondItem,secondEdge);
  this_00 = (this->graph).m_data + (2 < (int)firstEdge);
  pAVar2 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::edgeData
                     (this_00,first,second);
  if (pAVar2 != (AnchorData *)0x0) {
    removeAnchor_helper(this,first,second);
  }
  if (firstItem == secondItem) {
    data->item = firstItem;
  }
  else {
    firstItem = data->item;
  }
  data->from = first;
  data->to = second;
  data->field_0x78 =
       (firstItem == pQVar1) << 2 | data->field_0x78 & 0xeb | (2 < (int)firstEdge) << 4;
  Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::createEdge
            (this_00,first,second,data);
  return;
}

Assistant:

void QGraphicsAnchorLayoutPrivate::addAnchor_helper(QGraphicsLayoutItem *firstItem,
                                                    Qt::AnchorPoint firstEdge,
                                                    QGraphicsLayoutItem *secondItem,
                                                    Qt::AnchorPoint secondEdge,
                                                    AnchorData *data)
{
    Q_Q(QGraphicsAnchorLayout);

    const Qt::Orientation orientation = edgeOrientation(firstEdge);

    // Create or increase the reference count for the related vertices.
    AnchorVertex *v1 = addInternalVertex(firstItem, firstEdge);
    AnchorVertex *v2 = addInternalVertex(secondItem, secondEdge);

    // Remove previous anchor
    if (graph[orientation].edgeData(v1, v2)) {
        removeAnchor_helper(v1, v2);
    }

    // If its an internal anchor, set the associated item
    if (firstItem == secondItem)
        data->item = firstItem;

    data->isVertical = orientation == Qt::Vertical;

    // Create a bi-directional edge in the sense it can be transversed both
    // from v1 or v2. "data" however is shared between the two references
    // so we still know that the anchor direction is from 1 to 2.
    data->from = v1;
    data->to = v2;
#ifdef QT_DEBUG
    data->name = QString::fromLatin1("%1 --to--> %2").arg(v1->toString(), v2->toString());
#endif
    // ### bit to track internal anchors, since inside AnchorData methods
    // we don't have access to the 'q' pointer.
    data->isLayoutAnchor = (data->item == q);

    graph[orientation].createEdge(v1, v2, data);
}